

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
          (SmallVectorImpl<llvm::StringRef> *this,char **Args)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity <= uVar3
     ) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x10);
    uVar3 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  __s = *Args;
  *(char **)((long)pvVar1 + (ulong)uVar3 * 0x10) = __s;
  if (__s == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(__s);
  }
  *(size_t *)((long)pvVar1 + (ulong)uVar3 * 0x10 + 8) = sVar2;
  if (uVar3 < (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity)
  {
    (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = uVar3 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }